

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void enableCursor(_GLFWwindow *window)

{
  uchar mask [1];
  XIEventMask em;
  uchar local_21;
  XIEventMask local_20;
  
  if (window->rawMouseMotion != 0) {
    local_20.mask = &local_21;
    local_21 = '\0';
    local_20.deviceid = 1;
    local_20.mask_len = 1;
    (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&local_20,1);
  }
  _glfw.x11.disabledCursorWindow = (_GLFWwindow *)0x0;
  XUngrabPointer(_glfw.x11.display,0);
  _glfwPlatformSetCursorPos(window,_glfw.x11.restoreCursorPosX,_glfw.x11.restoreCursorPosY);
  updateCursorImage(window);
  return;
}

Assistant:

static void enableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        disableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = NULL;
    XUngrabPointer(_glfw.x11.display, CurrentTime);
    _glfwPlatformSetCursorPos(window,
                              _glfw.x11.restoreCursorPosX,
                              _glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
}